

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallGenerator::ConvertToAbsoluteDestination
          (string *__return_storage_ptr__,cmInstallGenerator *this,string *dest)

{
  bool bVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (dest->_M_string_length != 0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath((dest->_M_dataplus)._M_p);
    if (!bVar1) {
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x4dc47d);
    }
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(dest->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmInstallGenerator::ConvertToAbsoluteDestination(std::string const& dest) const
{
  std::string result;
  if(!dest.empty() &&
     !cmSystemTools::FileIsFullPath(dest.c_str()))
    {
    result = "${CMAKE_INSTALL_PREFIX}/";
    }
  result += dest;
  return result;
}